

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::setTimeHorizon
          (OptimalControlProblem *this,double startingTime,double finalTime)

{
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  char *pcVar4;
  pointer ppVar5;
  long *in_RDI;
  ostringstream errorMsg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *mayerCost;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  iterator costIterator;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>_>
  *in_stack_fffffffffffffdc8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffdd0;
  ostringstream *this_00;
  TimeRange *in_stack_fffffffffffffdd8;
  double local_218;
  double local_210;
  bool local_208;
  string local_200 [48];
  ostringstream local_1d0 [376];
  _Self local_58;
  _Base_ptr local_50;
  reference local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  long local_30;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
  local_28 [4];
  byte local_1;
  
  bVar1 = TimeRange::setTimeInterval
                    (in_stack_fffffffffffffdd8,(double)in_stack_fffffffffffffdd0,
                     (double)in_stack_fffffffffffffdc8);
  if (bVar1) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
    ::_Rb_tree_iterator(local_28);
    local_30 = *in_RDI + 0x410;
    local_38._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffdc8);
    local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffdc8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffdd0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffdc8);
      if (!bVar1) break;
      local_48 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_38);
      lVar2 = std::__cxx11::string::size();
      if (lVar2 != 0) {
        local_50 = (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>_>
                   ::find(in_stack_fffffffffffffdc8,(key_type *)0x2f8199);
        local_28[0]._M_node = local_50;
        local_58._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>_>
             ::end(in_stack_fffffffffffffdc8);
        bVar1 = std::operator==(local_28,&local_58);
        if (bVar1) {
          this_00 = local_1d0;
          std::__cxx11::ostringstream::ostringstream(this_00);
          poVar3 = std::operator<<((ostream *)this_00,"Unable to find cost named ");
          poVar3 = std::operator<<(poVar3,(string *)local_48);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          iDynTree::reportError("OptimalControlProblem","updateCostTimeRange",pcVar4);
          std::__cxx11::string::~string(local_200);
          local_1 = 0;
          std::__cxx11::ostringstream::~ostringstream(local_1d0);
          goto LAB_002f8322;
        }
        TimeRange::Instant((double)in_stack_fffffffffffffdd0);
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
                               *)0x2f82e4);
        (ppVar5->second).timeRange.m_initTime = local_218;
        (ppVar5->second).timeRange.m_endTime = local_210;
        (ppVar5->second).timeRange.m_anyTime = local_208;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_38);
    }
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
LAB_002f8322:
  return (bool)(local_1 & 1);
}

Assistant:

bool OptimalControlProblem::setTimeHorizon(double startingTime, double finalTime)
        {
            if (!(m_pimpl->horizon.setTimeInterval(startingTime,finalTime))) {
                return false;
            }

            CostsMap::iterator costIterator;
            for (auto& mayerCost : m_pimpl->mayerCostnames){
                if (mayerCost.size() > 0){
                    costIterator = m_pimpl->costs.find(mayerCost);
                    if (costIterator == m_pimpl->costs.end()){
                        std::ostringstream errorMsg;
                        errorMsg << "Unable to find cost named "<<mayerCost<< std::endl;
                        reportError("OptimalControlProblem", "updateCostTimeRange", errorMsg.str().c_str());
                        return false;
                    }

                    costIterator->second.timeRange = TimeRange::Instant(finalTime);
                }
            }

            return true;
        }